

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O1

void __thiscall
OctreeBuilder::CmdBuild(OctreeBuilder *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  uint uVar1;
  CommandBuffer *pCVar2;
  uint32_t uVar3;
  initializer_list<VkBufferCopy> __l;
  initializer_list<VkBufferCopy> __l_00;
  initializer_list<VkBufferMemoryBarrier> __l_01;
  initializer_list<VkBufferMemoryBarrier> __l_02;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l_03;
  initializer_list<VkBufferMemoryBarrier> __l_04;
  initializer_list<VkBufferMemoryBarrier> __l_05;
  initializer_list<VkBufferMemoryBarrier> __l_06;
  initializer_list<VkBufferMemoryBarrier> __l_07;
  initializer_list<VkBufferMemoryBarrier> __l_08;
  allocator_type local_c9;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_c8;
  VkBufferCopy local_a8;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_88;
  undefined1 local_70 [60];
  uint32_t local_34;
  
  pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)(this->m_build_info_staging_buffer).
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)(this->m_build_info_staging_buffer).
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_88.
                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.
                     super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_88.
                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.
                     super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
    }
  }
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->m_build_info_buffer).
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->m_build_info_buffer).
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_c8.
                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_c8.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_c8.
                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_c8.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
    }
  }
  local_a8.srcOffset = 0;
  local_a8.dstOffset = 0;
  local_a8.size =
       (((this->m_build_info_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_BufferBase).m_size;
  __l._M_len = 1;
  __l._M_array = &local_a8;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)local_70,__l,&local_c9);
  myvk::CommandBuffer::CmdCopy
            (pCVar2,(Ptr<BufferBase> *)&local_88,(Ptr<BufferBase> *)&local_c8,
             (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)local_70);
  if ((pointer)local_70._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ - local_70._0_8_);
  }
  if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c8.
               super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.
               super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)(this->m_indirect_staging_buffer).
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)(this->m_indirect_staging_buffer).
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_88.
                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.
                     super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_88.
                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.
                     super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
    }
  }
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->m_indirect_buffer).
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->m_indirect_buffer).
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_c8.
                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_c8.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_c8.
                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_c8.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
    }
  }
  local_a8.srcOffset = 0;
  local_a8.dstOffset = 0;
  local_a8.size =
       (((this->m_indirect_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_BufferBase).m_size;
  __l_00._M_len = 1;
  __l_00._M_array = &local_a8;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)local_70,__l_00,&local_c9);
  myvk::CommandBuffer::CmdCopy
            (pCVar2,(Ptr<BufferBase> *)&local_88,(Ptr<BufferBase> *)&local_c8,
             (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)local_70);
  if ((pointer)local_70._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ - local_70._0_8_);
  }
  if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c8.
               super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.
               super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_a8.srcOffset = 0;
  local_a8.dstOffset = 0;
  local_a8.size = 0;
  myvk::BufferBase::GetMemoryBarrier
            ((VkBufferMemoryBarrier *)local_70,
             &((this->m_build_info_buffer).
               super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_BufferBase,0x1000,0x60,0xffffffff,0xffffffff);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_70;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (&local_88,__l_01,(allocator_type *)&local_c9);
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdPipelineBarrier
            (pCVar2,0x1000,0x800,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_a8,&local_88,
             &local_c8);
  if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((element_type *)
      local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_88.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_a8.srcOffset != (void *)0x0) {
    operator_delete((void *)local_a8.srcOffset,local_a8.size - local_a8.srcOffset);
  }
  pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_a8.srcOffset = 0;
  local_a8.dstOffset = 0;
  local_a8.size = 0;
  myvk::BufferBase::GetMemoryBarrier
            ((VkBufferMemoryBarrier *)local_70,
             &((this->m_indirect_buffer).
               super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_BufferBase,0x1000,0x41,0xffffffff,0xffffffff);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_70;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (&local_88,__l_02,(allocator_type *)&local_c9);
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdPipelineBarrier
            (pCVar2,0x1000,0x802,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_a8,&local_88,
             &local_c8);
  if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((element_type *)
      local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_88.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_a8.srcOffset != (void *)0x0) {
    operator_delete((void *)local_a8.srcOffset,local_a8.size - local_a8.srcOffset);
  }
  uVar1 = ((this->m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->m_voxel_fragment_count;
  local_34 = ((uVar1 >> 6) + 1) - (uint)((uVar1 & 0x3f) == 0);
  pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)(this->m_descriptor_set).
                super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)(this->m_descriptor_set).
                super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_88.
                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.
                     super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_88.
                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_88.
                     super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
    }
  }
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_88;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            *)local_70,__l_03,(allocator_type *)&local_c8);
  local_a8.srcOffset = 0;
  local_a8.dstOffset = 0;
  local_a8.size = 0;
  myvk::CommandBuffer::CmdBindDescriptorSets
            (pCVar2,(vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                     *)local_70,&this->m_pipeline_layout,VK_PIPELINE_BIND_POINT_COMPUTE,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
  if ((void *)local_a8.srcOffset != (void *)0x0) {
    operator_delete((void *)local_a8.srcOffset,local_a8.size - local_a8.srcOffset);
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)local_70);
  if (local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.
               super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  if (((this->m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_level != 0) {
    uVar3 = 1;
    do {
      pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      local_70._0_8_ =
           (this->m_init_node_pipeline).
           super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70._8_8_ =
           (this->m_init_node_pipeline).
           super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((pointer)local_70._8_8_ != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((pointer)local_70._8_8_)->dstOffset =
               (int)((pointer)local_70._8_8_)->dstOffset + 1;
          UNLOCK();
        }
        else {
          *(int *)&((pointer)local_70._8_8_)->dstOffset =
               (int)((pointer)local_70._8_8_)->dstOffset + 1;
        }
      }
      myvk::CommandBuffer::CmdBindPipeline(pCVar2,(Ptr<PipelineBase> *)local_70);
      if ((pointer)local_70._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
      }
      pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      local_70._0_8_ =
           (this->m_indirect_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_70._8_8_ =
           (this->m_indirect_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((pointer)local_70._8_8_ != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((pointer)local_70._8_8_)->dstOffset =
               (int)((pointer)local_70._8_8_)->dstOffset + 1;
          UNLOCK();
        }
        else {
          *(int *)&((pointer)local_70._8_8_)->dstOffset =
               (int)((pointer)local_70._8_8_)->dstOffset + 1;
        }
      }
      myvk::CommandBuffer::CmdDispatchIndirect(pCVar2,(Ptr<BufferBase> *)local_70,0);
      if ((pointer)local_70._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
      }
      pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      local_a8.srcOffset = 0;
      local_a8.dstOffset = 0;
      local_a8.size = 0;
      myvk::BufferBase::GetMemoryBarrier
                ((VkBufferMemoryBarrier *)local_70,
                 &((this->m_octree_buffer).
                   super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_BufferBase,0x40,0x60,0xffffffff,0xffffffff);
      __l_04._M_len = 1;
      __l_04._M_array = (VkBufferMemoryBarrier *)local_70;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                (&local_88,__l_04,(allocator_type *)&local_c9);
      local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      myvk::CommandBuffer::CmdPipelineBarrier
                (pCVar2,0x800,0x800,
                 (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_a8,&local_88,
                 &local_c8);
      if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((element_type *)
          local_88.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
          ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
        operator_delete(local_88.
                        super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)local_a8.srcOffset != (void *)0x0) {
        operator_delete((void *)local_a8.srcOffset,local_a8.size - local_a8.srcOffset);
      }
      pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      local_70._0_8_ =
           (this->m_tag_node_pipeline).
           super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70._8_8_ =
           (this->m_tag_node_pipeline).
           super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((pointer)local_70._8_8_ != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((pointer)local_70._8_8_)->dstOffset =
               (int)((pointer)local_70._8_8_)->dstOffset + 1;
          UNLOCK();
        }
        else {
          *(int *)&((pointer)local_70._8_8_)->dstOffset =
               (int)((pointer)local_70._8_8_)->dstOffset + 1;
        }
      }
      myvk::CommandBuffer::CmdBindPipeline(pCVar2,(Ptr<PipelineBase> *)local_70);
      if ((pointer)local_70._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
      }
      myvk::CommandBuffer::CmdDispatch
                ((command_buffer->
                 super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 local_34,1,1);
      if (uVar3 != ((this->m_voxelizer_ptr).
                    super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_level) {
        pCVar2 = (command_buffer->
                 super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8.srcOffset = 0;
        local_a8.dstOffset = 0;
        local_a8.size = 0;
        myvk::BufferBase::GetMemoryBarrier
                  ((VkBufferMemoryBarrier *)local_70,
                   &((this->m_octree_buffer).
                     super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_BufferBase,0x40,0x60,0xffffffff,0xffffffff);
        __l_05._M_len = 1;
        __l_05._M_array = (VkBufferMemoryBarrier *)local_70;
        std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                  (&local_88,__l_05,(allocator_type *)&local_c9);
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        myvk::CommandBuffer::CmdPipelineBarrier
                  (pCVar2,0x800,0x800,
                   (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_a8,&local_88,
                   &local_c8);
        if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((element_type *)
            local_88.
            super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
            _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
          operator_delete(local_88.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)local_a8.srcOffset != (void *)0x0) {
          operator_delete((void *)local_a8.srcOffset,local_a8.size - local_a8.srcOffset);
        }
        pCVar2 = (command_buffer->
                 super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_70._0_8_ =
             (this->m_alloc_node_pipeline).
             super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_70._8_8_ =
             (this->m_alloc_node_pipeline).
             super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if ((pointer)local_70._8_8_ != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((pointer)local_70._8_8_)->dstOffset =
                 (int)((pointer)local_70._8_8_)->dstOffset + 1;
            UNLOCK();
          }
          else {
            *(int *)&((pointer)local_70._8_8_)->dstOffset =
                 (int)((pointer)local_70._8_8_)->dstOffset + 1;
          }
        }
        myvk::CommandBuffer::CmdBindPipeline(pCVar2,(Ptr<PipelineBase> *)local_70);
        if ((pointer)local_70._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        pCVar2 = (command_buffer->
                 super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_70._0_8_ =
             (this->m_indirect_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_70._8_8_ =
             (this->m_indirect_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((pointer)local_70._8_8_ != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((pointer)local_70._8_8_)->dstOffset =
                 (int)((pointer)local_70._8_8_)->dstOffset + 1;
            UNLOCK();
          }
          else {
            *(int *)&((pointer)local_70._8_8_)->dstOffset =
                 (int)((pointer)local_70._8_8_)->dstOffset + 1;
          }
        }
        myvk::CommandBuffer::CmdDispatchIndirect(pCVar2,(Ptr<BufferBase> *)local_70,0);
        if ((pointer)local_70._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        pCVar2 = (command_buffer->
                 super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8.srcOffset = 0;
        local_a8.dstOffset = 0;
        local_a8.size = 0;
        myvk::BufferBase::GetMemoryBarrier
                  ((VkBufferMemoryBarrier *)local_70,
                   &((this->m_octree_buffer).
                     super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_BufferBase,0x40,0x60,0xffffffff,0xffffffff);
        __l_06._M_len = 1;
        __l_06._M_array = (VkBufferMemoryBarrier *)local_70;
        std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                  (&local_88,__l_06,(allocator_type *)&local_c9);
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        myvk::CommandBuffer::CmdPipelineBarrier
                  (pCVar2,0x800,0x800,
                   (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_a8,&local_88,
                   &local_c8);
        if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((element_type *)
            local_88.
            super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
            _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
          operator_delete(local_88.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)local_a8.srcOffset != (void *)0x0) {
          operator_delete((void *)local_a8.srcOffset,local_a8.size - local_a8.srcOffset);
        }
        pCVar2 = (command_buffer->
                 super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_70._0_8_ =
             (this->m_modify_arg_pipeline).
             super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_70._8_8_ =
             (this->m_modify_arg_pipeline).
             super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if ((pointer)local_70._8_8_ != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((pointer)local_70._8_8_)->dstOffset =
                 (int)((pointer)local_70._8_8_)->dstOffset + 1;
            UNLOCK();
          }
          else {
            *(int *)&((pointer)local_70._8_8_)->dstOffset =
                 (int)((pointer)local_70._8_8_)->dstOffset + 1;
          }
        }
        myvk::CommandBuffer::CmdBindPipeline(pCVar2,(Ptr<PipelineBase> *)local_70);
        if ((pointer)local_70._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        myvk::CommandBuffer::CmdDispatch
                  ((command_buffer->
                   super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,1,1,1
                  );
        pCVar2 = (command_buffer->
                 super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8.srcOffset = 0;
        local_a8.dstOffset = 0;
        local_a8.size = 0;
        myvk::BufferBase::GetMemoryBarrier
                  ((VkBufferMemoryBarrier *)local_70,
                   &((this->m_indirect_buffer).
                     super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_BufferBase,0x40,0x41,0xffffffff,0xffffffff);
        __l_07._M_len = 1;
        __l_07._M_array = (VkBufferMemoryBarrier *)local_70;
        std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                  (&local_88,__l_07,(allocator_type *)&local_c9);
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        myvk::CommandBuffer::CmdPipelineBarrier
                  (pCVar2,0x800,0x802,
                   (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_a8,&local_88,
                   &local_c8);
        if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((element_type *)
            local_88.
            super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
            _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
          operator_delete(local_88.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)local_a8.srcOffset != (void *)0x0) {
          operator_delete((void *)local_a8.srcOffset,local_a8.size - local_a8.srcOffset);
        }
        pCVar2 = (command_buffer->
                 super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8.srcOffset = 0;
        local_a8.dstOffset = 0;
        local_a8.size = 0;
        myvk::BufferBase::GetMemoryBarrier
                  ((VkBufferMemoryBarrier *)local_70,
                   &((this->m_build_info_buffer).
                     super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_BufferBase,0x40,0x20,0xffffffff,0xffffffff);
        __l_08._M_len = 1;
        __l_08._M_array = (VkBufferMemoryBarrier *)local_70;
        std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                  (&local_88,__l_08,(allocator_type *)&local_c9);
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        myvk::CommandBuffer::CmdPipelineBarrier
                  (pCVar2,0x800,0x800,
                   (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_a8,&local_88,
                   &local_c8);
        if (local_c8.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((element_type *)
            local_88.
            super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
            _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
          operator_delete(local_88.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)local_a8.srcOffset != (void *)0x0) {
          operator_delete((void *)local_a8.srcOffset,local_a8.size - local_a8.srcOffset);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 <= ((this->m_voxelizer_ptr).
                       super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_level);
  }
  return;
}

Assistant:

void OctreeBuilder::CmdBuild(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) const {
	// transfers
	{
		command_buffer->CmdCopy(m_build_info_staging_buffer, m_build_info_buffer,
		                        {{0, 0, m_build_info_buffer->GetSize()}});
		command_buffer->CmdCopy(m_indirect_staging_buffer, m_indirect_buffer, {{0, 0, m_indirect_buffer->GetSize()}});

		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
		    {m_build_info_buffer->GetMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT,
		                                           VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
		    {});

		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT | VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT,
		    {},
		    {m_indirect_buffer->GetMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT,
		                                         VK_ACCESS_INDIRECT_COMMAND_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
		    {});
	}

	uint32_t fragment_group_x = group_x_64(m_voxelizer_ptr->GetVoxelFragmentCount());

	command_buffer->CmdBindDescriptorSets({m_descriptor_set}, m_pipeline_layout, VK_PIPELINE_BIND_POINT_COMPUTE, {});

	for (uint32_t i = 1; i <= m_voxelizer_ptr->GetLevel(); ++i) {
		command_buffer->CmdBindPipeline(m_init_node_pipeline);
		command_buffer->CmdDispatchIndirect(m_indirect_buffer);

		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
		    {m_octree_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
		                                       VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
		    {});

		command_buffer->CmdBindPipeline(m_tag_node_pipeline);
		command_buffer->CmdDispatch(fragment_group_x, 1, 1);

		if (i != m_voxelizer_ptr->GetLevel()) {
			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_octree_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
			                                       VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
			    {});

			command_buffer->CmdBindPipeline(m_alloc_node_pipeline);
			command_buffer->CmdDispatchIndirect(m_indirect_buffer);

			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_octree_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
			                                       VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
			    {});

			command_buffer->CmdBindPipeline(m_modify_arg_pipeline);
			command_buffer->CmdDispatch(1, 1, 1);

			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT,
			    VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT | VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_indirect_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
			                                         VK_ACCESS_INDIRECT_COMMAND_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT)},
			    {});
			command_buffer->CmdPipelineBarrier(
			    VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
			    {m_build_info_buffer->GetMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT)}, {});
		}
	}
}